

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# find_empty_space.cpp
# Opt level: O2

Screen_mask * cppurses::detail::find_empty_space(Screen_mask *__return_storage_ptr__,Widget *w)

{
  pointer puVar1;
  anon_class_8_1_a8d81ce6 widths_equal;
  size_t sVar2;
  pointer puVar3;
  Widget *pWVar4;
  long lVar5;
  long lVar6;
  unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_> *child;
  pointer puVar7;
  size_t sVar8;
  size_t x;
  Reference RVar9;
  
  puVar1 = (w->children).children_.
           super__Vector_base<std::unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_>,_std::allocator<std::unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  sVar8 = 0;
  puVar7 = (w->children).children_.
           super__Vector_base<std::unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_>,_std::allocator<std::unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (puVar3 = puVar7; puVar3 != puVar1; puVar3 = puVar3 + 1) {
    pWVar4 = (puVar3->_M_t).
             super___uniq_ptr_impl<cppurses::Widget,_std::default_delete<cppurses::Widget>_>._M_t.
             super__Tuple_impl<0UL,_cppurses::Widget_*,_std::default_delete<cppurses::Widget>_>.
             super__Head_base<0UL,_cppurses::Widget_*,_false>._M_head_impl;
    if (pWVar4->enabled_ == true) {
      sVar8 = sVar8 + pWVar4->outer_height_;
    }
  }
  sVar2 = Widget::height(w);
  if (sVar8 == sVar2) {
    sVar8 = Widget::width(w);
    lVar5 = (long)puVar1 - (long)puVar7;
    puVar3 = puVar7;
    for (lVar6 = lVar5 >> 5; 0 < lVar6; lVar6 = lVar6 + -1) {
      pWVar4 = (puVar3->_M_t).
               super___uniq_ptr_impl<cppurses::Widget,_std::default_delete<cppurses::Widget>_>._M_t.
               super__Tuple_impl<0UL,_cppurses::Widget_*,_std::default_delete<cppurses::Widget>_>.
               super__Head_base<0UL,_cppurses::Widget_*,_false>._M_head_impl;
      if ((pWVar4->enabled_ == true) && (pWVar4->outer_width_ != sVar8)) goto LAB_00164ab1;
      pWVar4 = puVar3[1]._M_t.
               super___uniq_ptr_impl<cppurses::Widget,_std::default_delete<cppurses::Widget>_>._M_t.
               super__Tuple_impl<0UL,_cppurses::Widget_*,_std::default_delete<cppurses::Widget>_>.
               super__Head_base<0UL,_cppurses::Widget_*,_false>._M_head_impl;
      if ((pWVar4->enabled_ == true) && (pWVar4->outer_width_ != sVar8)) {
        puVar3 = puVar3 + 1;
        goto LAB_00164ab1;
      }
      pWVar4 = puVar3[2]._M_t.
               super___uniq_ptr_impl<cppurses::Widget,_std::default_delete<cppurses::Widget>_>._M_t.
               super__Tuple_impl<0UL,_cppurses::Widget_*,_std::default_delete<cppurses::Widget>_>.
               super__Head_base<0UL,_cppurses::Widget_*,_false>._M_head_impl;
      if ((pWVar4->enabled_ == true) && (pWVar4->outer_width_ != sVar8)) {
        puVar3 = puVar3 + 2;
        goto LAB_00164ab1;
      }
      pWVar4 = puVar3[3]._M_t.
               super___uniq_ptr_impl<cppurses::Widget,_std::default_delete<cppurses::Widget>_>._M_t.
               super__Tuple_impl<0UL,_cppurses::Widget_*,_std::default_delete<cppurses::Widget>_>.
               super__Head_base<0UL,_cppurses::Widget_*,_false>._M_head_impl;
      if ((pWVar4->enabled_ == true) && (pWVar4->outer_width_ != sVar8)) {
        puVar3 = puVar3 + 3;
        goto LAB_00164ab1;
      }
      puVar3 = puVar3 + 4;
      lVar5 = lVar5 + -0x20;
    }
    lVar5 = lVar5 >> 3;
    if (lVar5 == 1) {
LAB_00164a83:
      pWVar4 = (puVar3->_M_t).
               super___uniq_ptr_impl<cppurses::Widget,_std::default_delete<cppurses::Widget>_>._M_t.
               super__Tuple_impl<0UL,_cppurses::Widget_*,_std::default_delete<cppurses::Widget>_>.
               super__Head_base<0UL,_cppurses::Widget_*,_false>._M_head_impl;
      if ((pWVar4->enabled_ == true) && (pWVar4->outer_width_ != sVar8)) goto LAB_00164ab1;
    }
    else {
      if (lVar5 == 2) {
LAB_00164a6a:
        pWVar4 = (puVar3->_M_t).
                 super___uniq_ptr_impl<cppurses::Widget,_std::default_delete<cppurses::Widget>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cppurses::Widget_*,_std::default_delete<cppurses::Widget>_>.
                 super__Head_base<0UL,_cppurses::Widget_*,_false>._M_head_impl;
        if ((pWVar4->enabled_ != true) || (pWVar4->outer_width_ == sVar8)) {
          puVar3 = puVar3 + 1;
          goto LAB_00164a83;
        }
      }
      else {
        if (lVar5 != 3) goto LAB_00164c9b;
        pWVar4 = (puVar3->_M_t).
                 super___uniq_ptr_impl<cppurses::Widget,_std::default_delete<cppurses::Widget>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cppurses::Widget_*,_std::default_delete<cppurses::Widget>_>.
                 super__Head_base<0UL,_cppurses::Widget_*,_false>._M_head_impl;
        if ((pWVar4->enabled_ != true) || (pWVar4->outer_width_ == sVar8)) {
          puVar3 = puVar3 + 1;
          goto LAB_00164a6a;
        }
      }
LAB_00164ab1:
      if (puVar3 != puVar1) goto LAB_00164aba;
    }
LAB_00164c9b:
    (__return_storage_ptr__->bits_).super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    *(undefined8 *)
     &(__return_storage_ptr__->bits_).super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
    (__return_storage_ptr__->bits_).super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    *(undefined8 *)
     &(__return_storage_ptr__->bits_).super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
    (__return_storage_ptr__->area_).width = 0;
    (__return_storage_ptr__->area_).height = 0;
    (__return_storage_ptr__->offset_).x = 0;
    (__return_storage_ptr__->offset_).y = 0;
    (__return_storage_ptr__->bits_).super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  }
  else {
LAB_00164aba:
    sVar8 = 0;
    for (puVar3 = puVar7; puVar3 != puVar1; puVar3 = puVar3 + 1) {
      pWVar4 = (puVar3->_M_t).
               super___uniq_ptr_impl<cppurses::Widget,_std::default_delete<cppurses::Widget>_>._M_t.
               super__Tuple_impl<0UL,_cppurses::Widget_*,_std::default_delete<cppurses::Widget>_>.
               super__Head_base<0UL,_cppurses::Widget_*,_false>._M_head_impl;
      if (pWVar4->enabled_ == true) {
        sVar8 = sVar8 + pWVar4->outer_width_;
      }
    }
    sVar2 = Widget::width(w);
    if (sVar8 == sVar2) {
      sVar8 = Widget::height(w);
      lVar5 = (long)puVar1 - (long)puVar7;
      for (lVar6 = lVar5 >> 5; 0 < lVar6; lVar6 = lVar6 + -1) {
        pWVar4 = (puVar7->_M_t).
                 super___uniq_ptr_impl<cppurses::Widget,_std::default_delete<cppurses::Widget>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cppurses::Widget_*,_std::default_delete<cppurses::Widget>_>.
                 super__Head_base<0UL,_cppurses::Widget_*,_false>._M_head_impl;
        if ((pWVar4->enabled_ == true) && (pWVar4->outer_height_ != sVar8)) goto LAB_00164bf7;
        pWVar4 = puVar7[1]._M_t.
                 super___uniq_ptr_impl<cppurses::Widget,_std::default_delete<cppurses::Widget>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cppurses::Widget_*,_std::default_delete<cppurses::Widget>_>.
                 super__Head_base<0UL,_cppurses::Widget_*,_false>._M_head_impl;
        if ((pWVar4->enabled_ == true) && (pWVar4->outer_height_ != sVar8)) {
          puVar7 = puVar7 + 1;
          goto LAB_00164bf7;
        }
        pWVar4 = puVar7[2]._M_t.
                 super___uniq_ptr_impl<cppurses::Widget,_std::default_delete<cppurses::Widget>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cppurses::Widget_*,_std::default_delete<cppurses::Widget>_>.
                 super__Head_base<0UL,_cppurses::Widget_*,_false>._M_head_impl;
        if ((pWVar4->enabled_ == true) && (pWVar4->outer_height_ != sVar8)) {
          puVar7 = puVar7 + 2;
          goto LAB_00164bf7;
        }
        pWVar4 = puVar7[3]._M_t.
                 super___uniq_ptr_impl<cppurses::Widget,_std::default_delete<cppurses::Widget>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cppurses::Widget_*,_std::default_delete<cppurses::Widget>_>.
                 super__Head_base<0UL,_cppurses::Widget_*,_false>._M_head_impl;
        if ((pWVar4->enabled_ == true) && (pWVar4->outer_height_ != sVar8)) {
          puVar7 = puVar7 + 3;
          goto LAB_00164bf7;
        }
        puVar7 = puVar7 + 4;
        lVar5 = lVar5 + -0x20;
      }
      lVar5 = lVar5 >> 3;
      if (lVar5 == 1) {
LAB_00164bc9:
        pWVar4 = (puVar7->_M_t).
                 super___uniq_ptr_impl<cppurses::Widget,_std::default_delete<cppurses::Widget>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cppurses::Widget_*,_std::default_delete<cppurses::Widget>_>.
                 super__Head_base<0UL,_cppurses::Widget_*,_false>._M_head_impl;
        if ((pWVar4->enabled_ != true) || (pWVar4->outer_height_ == sVar8)) goto LAB_00164c9b;
      }
      else if (lVar5 == 2) {
LAB_00164bb0:
        pWVar4 = (puVar7->_M_t).
                 super___uniq_ptr_impl<cppurses::Widget,_std::default_delete<cppurses::Widget>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cppurses::Widget_*,_std::default_delete<cppurses::Widget>_>.
                 super__Head_base<0UL,_cppurses::Widget_*,_false>._M_head_impl;
        if ((pWVar4->enabled_ != true) || (pWVar4->outer_height_ == sVar8)) {
          puVar7 = puVar7 + 1;
          goto LAB_00164bc9;
        }
      }
      else {
        if (lVar5 != 3) goto LAB_00164c9b;
        pWVar4 = (puVar7->_M_t).
                 super___uniq_ptr_impl<cppurses::Widget,_std::default_delete<cppurses::Widget>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cppurses::Widget_*,_std::default_delete<cppurses::Widget>_>.
                 super__Head_base<0UL,_cppurses::Widget_*,_false>._M_head_impl;
        if ((pWVar4->enabled_ != true) || (pWVar4->outer_height_ == sVar8)) {
          puVar7 = puVar7 + 1;
          goto LAB_00164bb0;
        }
      }
LAB_00164bf7:
      if (puVar7 == puVar1) goto LAB_00164c9b;
    }
    Screen_mask::Screen_mask(__return_storage_ptr__,w,Inner);
    puVar1 = (w->children).children_.
             super__Vector_base<std::unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_>,_std::allocator<std::unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar7 = (w->children).children_.
                  super__Vector_base<std::unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_>,_std::allocator<std::unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar7 != puVar1; puVar7 = puVar7 + 1)
    {
      pWVar4 = (puVar7->_M_t).
               super___uniq_ptr_impl<cppurses::Widget,_std::default_delete<cppurses::Widget>_>._M_t.
               super__Tuple_impl<0UL,_cppurses::Widget_*,_std::default_delete<cppurses::Widget>_>.
               super__Head_base<0UL,_cppurses::Widget_*,_false>._M_head_impl;
      if (pWVar4->enabled_ == true) {
        sVar8 = (pWVar4->top_left_position_).y;
        for (sVar2 = sVar8; sVar2 < sVar8 + pWVar4->outer_height_; sVar2 = sVar2 + 1) {
          sVar8 = (pWVar4->top_left_position_).x;
          for (x = sVar8; x < sVar8 + pWVar4->outer_width_; x = x + 1) {
            RVar9 = Screen_mask::at(__return_storage_ptr__,x,sVar2);
            *RVar9._M_p = *RVar9._M_p | RVar9._M_mask;
            pWVar4 = (puVar7->_M_t).
                     super___uniq_ptr_impl<cppurses::Widget,_std::default_delete<cppurses::Widget>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cppurses::Widget_*,_std::default_delete<cppurses::Widget>_>
                     .super__Head_base<0UL,_cppurses::Widget_*,_false>._M_head_impl;
            sVar8 = (pWVar4->top_left_position_).x;
          }
          sVar8 = (pWVar4->top_left_position_).y;
        }
      }
    }
    std::vector<bool,_std::allocator<bool>_>::flip(&__return_storage_ptr__->bits_);
  }
  return __return_storage_ptr__;
}

Assistant:

Screen_mask find_empty_space(const Widget& w) {
    if (children_completely_cover(w)) {
        return Screen_mask{};
    }
    auto mask = Screen_mask{w, Screen_mask::Inner};
    mark_covered_tiles(w, mask);
    mask.flip();
    return mask;
}